

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * fts3QuoteId(char *zInput)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  
  sVar2 = strlen(zInput);
  iVar1 = sqlite3_initialize();
  if ((iVar1 == 0) &&
     (pcVar3 = (char *)sqlite3Malloc((long)((int)sVar2 * 2 + 3)), pcVar3 != (char *)0x0)) {
    *pcVar3 = '\"';
    pcVar4 = pcVar3;
    do {
      cVar5 = *zInput;
      if (cVar5 == '\"') {
        pcVar4[1] = '\"';
        pcVar4 = pcVar4 + 2;
        cVar5 = *zInput;
      }
      else {
        if (cVar5 == '\0') {
          pcVar4[1] = '\"';
          pcVar4[2] = '\0';
          return pcVar3;
        }
        pcVar4 = pcVar4 + 1;
      }
      *pcVar4 = cVar5;
      zInput = zInput + 1;
    } while( true );
  }
  return (char *)0x0;
}

Assistant:

static char *fts3QuoteId(char const *zInput){
  sqlite3_int64 nRet;
  char *zRet;
  nRet = 2 + (int)strlen(zInput)*2 + 1;
  zRet = sqlite3_malloc64(nRet);
  if( zRet ){
    int i;
    char *z = zRet;
    *(z++) = '"';
    for(i=0; zInput[i]; i++){
      if( zInput[i]=='"' ) *(z++) = '"';
      *(z++) = zInput[i];
    }
    *(z++) = '"';
    *(z++) = '\0';
  }
  return zRet;
}